

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

int uv_thread_setaffinity(uv_thread_t *tid,char *cpumask,char *oldmask,size_t mask_size)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  cpu_set_t cpuset;
  cpu_set_t local_a8;
  
  uVar1 = uv_cpumask_size();
  uVar2 = uVar1;
  if (((-1 < (int)uVar1) && (uVar2 = 0xffffffea, uVar1 <= mask_size)) &&
     ((oldmask == (char *)0x0 ||
      (uVar2 = uv_thread_getaffinity(tid,oldmask,mask_size), -1 < (int)uVar2)))) {
    local_a8.__bits[0xe] = 0;
    local_a8.__bits[0xf] = 0;
    local_a8.__bits[0xc] = 0;
    local_a8.__bits[0xd] = 0;
    local_a8.__bits[10] = 0;
    local_a8.__bits[0xb] = 0;
    local_a8.__bits[8] = 0;
    local_a8.__bits[9] = 0;
    local_a8.__bits[6] = 0;
    local_a8.__bits[7] = 0;
    local_a8.__bits[4] = 0;
    local_a8.__bits[5] = 0;
    local_a8.__bits[2] = 0;
    local_a8.__bits[3] = 0;
    local_a8.__bits[0] = 0;
    local_a8.__bits[1] = 0;
    if (uVar1 != 0) {
      uVar4 = 1;
      if (1 < (int)uVar1) {
        uVar4 = (ulong)uVar1;
      }
      uVar5 = 0;
      do {
        if ((uVar5 < 0x400) && (cpumask[uVar5] != '\0')) {
          local_a8.__bits[uVar5 >> 6] = local_a8.__bits[uVar5 >> 6] | 1L << ((byte)uVar5 & 0x3f);
        }
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    iVar3 = pthread_setaffinity_np(*tid,0x80,&local_a8);
    uVar2 = -iVar3;
  }
  return uVar2;
}

Assistant:

int uv_thread_setaffinity(uv_thread_t* tid,
                          char* cpumask,
                          char* oldmask,
                          size_t mask_size) {
  int i;
  int r;
  uv__cpu_set_t cpuset;
  int cpumasksize;

  cpumasksize = uv_cpumask_size();
  if (cpumasksize < 0)
    return cpumasksize;
  if (mask_size < (size_t)cpumasksize)
    return UV_EINVAL;

  if (oldmask != NULL) {
    r = uv_thread_getaffinity(tid, oldmask, mask_size);
    if (r < 0)
      return r;
  }

  CPU_ZERO(&cpuset);
  for (i = 0; i < cpumasksize; i++)
    if (cpumask[i])
      CPU_SET(i, &cpuset);

#if defined(__ANDROID__)
  if (sched_setaffinity(pthread_gettid_np(*tid), sizeof(cpuset), &cpuset))
    r = errno;
  else
    r = 0;
#else
  r = pthread_setaffinity_np(*tid, sizeof(cpuset), &cpuset);
#endif

  return UV__ERR(r);
}